

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O2

int array_list_expand_internal(array_list *arr,size_t max)

{
  ulong uVar1;
  void **ppvVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = arr->size;
  iVar3 = 0;
  if (uVar1 <= max) {
    uVar4 = uVar1 * 2;
    if (uVar1 * 2 <= max) {
      uVar4 = max;
    }
    if (0x7ffffffffffffffe < uVar1) {
      uVar4 = max;
    }
    iVar3 = -1;
    if (uVar4 >> 0x3d == 0) {
      ppvVar2 = (void **)realloc(arr->array,uVar4 * 8);
      if (ppvVar2 != (void **)0x0) {
        arr->array = ppvVar2;
        arr->size = uVar4;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int array_list_expand_internal(struct array_list *arr, size_t max)
{
	void *t;
	size_t new_size;

	if (max < arr->size)
		return 0;
	/* Avoid undefined behaviour on size_t overflow */
	if (arr->size >= SIZE_T_MAX / 2)
		new_size = max;
	else
	{
		new_size = arr->size << 1;
		if (new_size < max)
			new_size = max;
	}
	if (new_size > (~((size_t)0)) / sizeof(void *))
		return -1;
	if (!(t = realloc(arr->array, new_size * sizeof(void *))))
		return -1;
	arr->array = (void **)t;
	arr->size = new_size;
	return 0;
}